

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

int __thiscall draco::CornerTable::ConfidentValence(CornerTable *this,VertexIndex v)

{
  bool bVar1;
  undefined4 in_ESI;
  int valence;
  VertexRingIterator<draco::CornerTable> vi;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  VertexRingIterator<draco::CornerTable> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  VertexIndex in_stack_ffffffffffffffe4;
  
  VertexRingIterator<draco::CornerTable>::VertexRingIterator
            (in_stack_ffffffffffffffd8,(CornerTable *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffe4);
  iVar2 = 0;
  while( true ) {
    bVar1 = VertexRingIterator<draco::CornerTable>::End
                      ((VertexRingIterator<draco::CornerTable> *)0x1b4e4a);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    iVar2 = iVar2 + 1;
    VertexRingIterator<draco::CornerTable>::Next
              ((VertexRingIterator<draco::CornerTable> *)
               CONCAT44(in_stack_ffffffffffffffe4.value_,in_stack_ffffffffffffffe0));
  }
  return iVar2;
}

Assistant:

int CornerTable::ConfidentValence(VertexIndex v) const {
  DRACO_DCHECK_GE(v.value(), 0);
  DRACO_DCHECK_LT(v.value(), num_vertices());
  VertexRingIterator<CornerTable> vi(this, v);
  int valence = 0;
  for (; !vi.End(); vi.Next()) {
    ++valence;
  }
  return valence;
}